

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void lsl_GvEw(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  int iVar3;
  ulong uVar4;
  UIntPtr UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  UInt8 UVar12;
  uint uVar13;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"lsl",4);
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
    UVar5 = (pMyDisasm->Reserved_).EIP_;
    if (uVar4 < UVar5 + 2 && uVar4 != 0) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
    else {
      iVar3 = (pMyDisasm->Reserved_).OperandSize;
      uVar13 = (uint)(*(byte *)(UVar5 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar13;
      if (iVar3 == 0x40 && uVar13 == 3) {
        (pMyDisasm->Reserved_).OperandSize = 0x20;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = iVar3;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar6 = EFLAGS_TABLE[0x3e].SF_;
      UVar7 = EFLAGS_TABLE[0x3e].ZF_;
      UVar8 = EFLAGS_TABLE[0x3e].AF_;
      UVar9 = EFLAGS_TABLE[0x3e].PF_;
      UVar10 = EFLAGS_TABLE[0x3e].CF_;
      UVar11 = EFLAGS_TABLE[0x3e].TF_;
      UVar12 = EFLAGS_TABLE[0x3e].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x3e].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar6;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar7;
      (pMyDisasm->Instruction).Flags.AF_ = UVar8;
      (pMyDisasm->Instruction).Flags.PF_ = UVar9;
      (pMyDisasm->Instruction).Flags.CF_ = UVar10;
      (pMyDisasm->Instruction).Flags.TF_ = UVar11;
      (pMyDisasm->Instruction).Flags.IF_ = UVar12;
      UVar6 = EFLAGS_TABLE[0x3e].NT_;
      UVar7 = EFLAGS_TABLE[0x3e].RF_;
      UVar8 = EFLAGS_TABLE[0x3e].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x3e].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar6;
      (pMyDisasm->Instruction).Flags.RF_ = UVar7;
      (pMyDisasm->Instruction).Flags.alignment = UVar8;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ lsl_GvEw(PDISASM pMyDisasm)
{
    Int32 i;
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

    pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "lsl");
    #endif

    GV.MemDecoration = Arg2word;
    i = GV.OperandSize;
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if ((GV.MOD_ == 0x3) && (GV.OperandSize == 64)){
      GV.OperandSize = 32;
    }
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = i;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;

    if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
      GV.ERROR_OPCODE = UD_;
    }
    FillFlags(pMyDisasm, 62);
}